

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

float64 * gauden_scale_densities_fwd
                    (float64 ***den,uint32 ***den_idx,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  float64 *pfVar3;
  float64 *pfVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  long lVar14;
  
  if (g->n_density < g->n_top) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x509,
                  "float64 *gauden_scale_densities_fwd(float64 ***, uint32 ***, uint32 *, uint32, gauden_t *)"
                 );
  }
  pfVar3 = (float64 *)
           __ckd_calloc__((ulong)g->n_feat,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x50b);
  auVar12 = _DAT_0011ec90;
  uVar5 = g->n_feat;
  uVar7 = (ulong)uVar5;
  if (uVar7 != 0) {
    lVar14 = uVar7 - 1;
    auVar11._8_4_ = (int)lVar14;
    auVar11._0_8_ = lVar14;
    auVar11._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_0011ec90;
    auVar13 = _DAT_0011ec80;
    do {
      auVar15 = auVar13 ^ auVar12;
      if ((bool)(~(auVar15._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar15._0_4_ ||
                  auVar11._4_4_ < auVar15._4_4_) & 1)) {
        *(undefined8 *)((long)pfVar3 + uVar6) = 0xffb9a2028368022e;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        *(undefined8 *)((long)pfVar3 + uVar6 + 8) = 0xffb9a2028368022e;
      }
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
      uVar6 = uVar6 + 0x10;
    } while ((uVar7 * 8 + 8 & 0xfffffffffffffff0) != uVar6);
  }
  if (n_cb != 0) {
    uVar6 = 0;
    do {
      if (uVar5 != 0) {
        uVar1 = cb[uVar6];
        uVar2 = g->n_top;
        uVar8 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            pfVar4 = den[uVar1][uVar8];
            auVar12._8_8_ = 0;
            auVar12._0_8_ = pfVar3[uVar8];
            uVar9 = 0;
            do {
              dVar10 = (double)pfVar4[uVar9];
              if (auVar12._0_8_ < dVar10) {
                pfVar3[uVar8] = (float64)dVar10;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = dVar10;
              }
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_cb);
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pfVar3[uVar6] = (float64)((double)pfVar3[uVar6] + -10.0);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (n_cb != 0) {
    uVar6 = 0;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar1 = cb[uVar6];
        uVar8 = (ulong)g->n_top;
        uVar9 = 0;
        do {
          if ((int)uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            pfVar4 = den[uVar1][uVar9];
            uVar7 = 0;
            do {
              dVar10 = exp((double)pfVar4[uVar7] - (double)pfVar3[uVar9]);
              pfVar4 = den[uVar1][uVar9];
              pfVar4[uVar7] = (float64)dVar10;
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)g->n_top;
            } while (uVar7 < uVar8);
            uVar7 = (ulong)g->n_feat;
          }
          uVar9 = uVar9 + 1;
          uVar5 = (uint)uVar7;
        } while (uVar9 < uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_cb);
  }
  return pfVar3;
}

Assistant:

float64 *
gauden_scale_densities_fwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *max_den;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    max_den = ckd_calloc(g->n_feat, sizeof(float64));

    /* Initialize max_den to some value in the domain */
    for (j = 0; j < g->n_feat; j++) {
	max_den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
    }

    /* Find the max for each feature */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		if (max_den[j] < den[c][j][k]) {
		    max_den[j] = den[c][j][k];
		}
	    }
	}
    }

    for (j = 0; j < g->n_feat; j++) {
	max_den[j] -= MAX_LOG_DEN;
    }
    
    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - max_den[j]);
	    }
	}
    }

    return max_den;
}